

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleParallelNoClockSimulationDataGenerator.cpp
# Opt level: O2

void __thiscall
SimpleParallelSimulationDataGenerator::Initialize
          (SimpleParallelSimulationDataGenerator *this,U32 simulation_sample_rate,
          SimpleParallelAnalyzerSettings *settings)

{
  pointer ppSVar1;
  pointer puVar2;
  pointer pCVar3;
  pointer pCVar4;
  SimulationChannelDescriptor *pSVar5;
  ulong uVar6;
  int iVar7;
  U16 val;
  Channel *local_40;
  SimulationChannelDescriptor *local_38;
  
  this->mSettings = settings;
  this->mSimulationSampleRateHz = simulation_sample_rate;
  ppSVar1 = (this->mData).
            super__Vector_base<SimulationChannelDescriptor_*,_std::allocator<SimulationChannelDescriptor_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if ((this->mData).
      super__Vector_base<SimulationChannelDescriptor_*,_std::allocator<SimulationChannelDescriptor_*>_>
      ._M_impl.super__Vector_impl_data._M_finish != ppSVar1) {
    (this->mData).
    super__Vector_base<SimulationChannelDescriptor_*,_std::allocator<SimulationChannelDescriptor_*>_>
    ._M_impl.super__Vector_impl_data._M_finish = ppSVar1;
  }
  puVar2 = (this->mDataMasks).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if ((this->mDataMasks).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl
      .super__Vector_impl_data._M_finish != puVar2) {
    (this->mDataMasks).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
    super__Vector_impl_data._M_finish = puVar2;
  }
  pCVar3 = (settings->mDataChannels).super__Vector_base<Channel,_std::allocator<Channel>_>._M_impl.
           super__Vector_impl_data._M_finish;
  pCVar4 = (settings->mDataChannels).super__Vector_base<Channel,_std::allocator<Channel>_>._M_impl.
           super__Vector_impl_data._M_start;
  local_40 = (Channel *)&this->mSimulationData;
  iVar7 = 0;
  for (uVar6 = 0; ((ulong)((long)pCVar3 - (long)pCVar4) >> 4 & 0xffffffff) != uVar6;
      uVar6 = uVar6 + 1) {
    local_38 = (SimulationChannelDescriptor *)
               SimulationChannelDescriptorGroup::Add
                         (local_40,(int)(this->mSettings->mDataChannels).
                                        super__Vector_base<Channel,_std::allocator<Channel>_>.
                                        _M_impl.super__Vector_impl_data._M_start + iVar7,
                          this->mSimulationSampleRateHz);
    std::vector<SimulationChannelDescriptor*,std::allocator<SimulationChannelDescriptor*>>::
    emplace_back<SimulationChannelDescriptor*>
              ((vector<SimulationChannelDescriptor*,std::allocator<SimulationChannelDescriptor*>> *)
               &this->mData,&local_38);
    val = (U16)(1 << ((byte)uVar6 & 0x1f));
    std::vector<unsigned_short,_std::allocator<unsigned_short>_>::push_back(&this->mDataMasks,&val);
    iVar7 = iVar7 + 0x10;
  }
  pSVar5 = (SimulationChannelDescriptor *)
           SimulationChannelDescriptorGroup::Add
                     (local_40,(int)this->mSettings + 0x28,this->mSimulationSampleRateHz);
  this->mClock = pSVar5;
  this->mValue = 0;
  return;
}

Assistant:

void SimpleParallelSimulationDataGenerator::Initialize( U32 simulation_sample_rate, SimpleParallelAnalyzerSettings* settings )
{
	mSettings = settings;
	mSimulationSampleRateHz = simulation_sample_rate;

	mData.clear();
	mDataMasks.clear();

	U32 count = (U32)mSettings->mDataChannels.size();
	for( U32 i=0; i<count; i++ )
	{
		mData.push_back( mSimulationData.Add( mSettings->mDataChannels[i], mSimulationSampleRateHz, BIT_LOW ) );
		U16 val = 1 << i;
		mDataMasks.push_back( val );
	}

	if( mSettings->mClockEdge == AnalyzerEnums::NegEdge )
		mClock = mSimulationData.Add( mSettings->mClockChannel, mSimulationSampleRateHz, BIT_LOW );
	else
		mClock = mSimulationData.Add( mSettings->mClockChannel, mSimulationSampleRateHz, BIT_HIGH );

	mValue = 0;
}